

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

void __thiscall IR::BranchInstr::Invert(BranchInstr *this)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  OVar1 = (this->super_Instr).m_opcode;
  if (OVar1 < BrHasSideEffects) {
    if (OVar1 < BrOnEmpty) {
      switch(OVar1) {
      case Br:
        return;
      case BrNotHasSideEffects:
        (this->super_Instr).m_opcode = BrHasSideEffects;
        return;
      case BrFncNeqApply:
        (this->super_Instr).m_opcode = BrFncEqApply;
        return;
      case BrEq_A:
        (this->super_Instr).m_opcode = BrNotEq_A;
        return;
      case BrNeq_A:
        (this->super_Instr).m_opcode = BrNotNeq_A;
        return;
      case BrFalse_A:
        (this->super_Instr).m_opcode = BrTrue_A;
        return;
      case BrTrue_A:
        (this->super_Instr).m_opcode = BrFalse_A;
        return;
      case BrGe_A:
        (this->super_Instr).m_opcode = BrNotGe_A;
        return;
      case BrGt_A:
        (this->super_Instr).m_opcode = BrNotGt_A;
        return;
      case BrLt_A:
        (this->super_Instr).m_opcode = BrNotLt_A;
        return;
      case BrLe_A:
        (this->super_Instr).m_opcode = BrNotLe_A;
        return;
      case BrSrEq_A:
        (this->super_Instr).m_opcode = BrSrNotEq_A;
        return;
      case BrSrNeq_A:
        (this->super_Instr).m_opcode = BrSrNotNeq_A;
        return;
      case BrOnHasLocalProperty:
        (this->super_Instr).m_opcode = BrOnNoLocalProperty;
        return;
      }
    }
    else {
      if (OVar1 == BrOnEmpty) {
        (this->super_Instr).m_opcode = BrOnNotEmpty;
        return;
      }
      if (OVar1 == BrOnHasProperty) {
        (this->super_Instr).m_opcode = BrOnNoProperty;
        return;
      }
      if (OVar1 == BrOnNoProperty) {
        (this->super_Instr).m_opcode = BrOnHasProperty;
        return;
      }
    }
  }
  else if (OVar1 < BrOnNotEmpty) {
    switch(OVar1) {
    case BrHasSideEffects:
      (this->super_Instr).m_opcode = BrNotHasSideEffects;
      return;
    case BrFncEqApply:
      (this->super_Instr).m_opcode = BrFncNeqApply;
      return;
    case BrUnGe_A:
      (this->super_Instr).m_opcode = BrUnLt_A;
      return;
    case BrUnGt_A:
      (this->super_Instr).m_opcode = BrUnLe_A;
      return;
    case BrUnLt_A:
      (this->super_Instr).m_opcode = BrUnGe_A;
      return;
    case BrUnLe_A:
      (this->super_Instr).m_opcode = BrUnGt_A;
      return;
    case BrOnNoLocalProperty:
      (this->super_Instr).m_opcode = BrOnHasLocalProperty;
      return;
    case BrNotEq_A:
      (this->super_Instr).m_opcode = BrEq_A;
      return;
    case BrNotNeq_A:
      (this->super_Instr).m_opcode = BrNeq_A;
      return;
    case BrSrNotEq_A:
      (this->super_Instr).m_opcode = BrSrEq_A;
      return;
    case BrSrNotNeq_A:
      (this->super_Instr).m_opcode = BrSrNeq_A;
      return;
    case BrNotGe_A:
      (this->super_Instr).m_opcode = BrGe_A;
      return;
    case BrNotGt_A:
      (this->super_Instr).m_opcode = BrGt_A;
      return;
    case BrNotLt_A:
      (this->super_Instr).m_opcode = BrLt_A;
      return;
    case BrNotLe_A:
      (this->super_Instr).m_opcode = BrLe_A;
      return;
    case BrNotAddr_A:
      (this->super_Instr).m_opcode = BrAddr_A;
      return;
    case BrAddr_A:
      (this->super_Instr).m_opcode = BrNotAddr_A;
      return;
    case BrOnException:
      (this->super_Instr).m_opcode = BrOnNoException;
      return;
    case BrEq_I4:
      (this->super_Instr).m_opcode = BrNeq_I4;
      return;
    case BrTrue_I4:
      (this->super_Instr).m_opcode = BrFalse_I4;
      return;
    case BrFalse_I4:
      (this->super_Instr).m_opcode = BrTrue_I4;
      return;
    case BrGe_I4:
      (this->super_Instr).m_opcode = BrLt_I4;
      return;
    case BrUnGe_I4:
      (this->super_Instr).m_opcode = BrUnLt_I4;
      return;
    case BrGt_I4:
      (this->super_Instr).m_opcode = BrLe_I4;
      return;
    case BrUnGt_I4:
      (this->super_Instr).m_opcode = BrUnLe_I4;
      return;
    case BrLt_I4:
      (this->super_Instr).m_opcode = BrGe_I4;
      return;
    case BrUnLt_I4:
      (this->super_Instr).m_opcode = BrUnGe_I4;
      return;
    case BrLe_I4:
      (this->super_Instr).m_opcode = BrGt_I4;
      return;
    case BrUnLe_I4:
      (this->super_Instr).m_opcode = BrUnGt_I4;
      return;
    case BrNeq_I4:
      (this->super_Instr).m_opcode = BrEq_I4;
      return;
    }
  }
  else {
    if (OVar1 == BrOnNotEmpty) {
      (this->super_Instr).m_opcode = BrOnEmpty;
      return;
    }
    if (OVar1 == BrFncCachedScopeEq) {
      (this->super_Instr).m_opcode = BrFncCachedScopeNeq;
      return;
    }
    if (OVar1 == BrFncCachedScopeNeq) {
      (this->super_Instr).m_opcode = BrFncCachedScopeEq;
      return;
    }
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar4 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                     ,0x7e2,"((0))","Unhandled branch");
  if (bVar3) {
    *puVar4 = 0;
    return;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void
BranchInstr::Invert()
{
    /*
     * If one of the operands to a relational operator is 'undefined', the result
     * is always false. Don't invert such branches as they result in a jump to
     * the wrong target.
     */

    switch (this->m_opcode)
    {
    case Js::OpCode::BrGt_A:
        this->m_opcode = Js::OpCode::BrNotGt_A;
        break;

    case Js::OpCode::BrNotGt_A:
        this->m_opcode = Js::OpCode::BrGt_A;
        break;

    case Js::OpCode::BrGe_A:
        this->m_opcode = Js::OpCode::BrNotGe_A;
        break;

    case Js::OpCode::BrNotGe_A:
        this->m_opcode = Js::OpCode::BrGe_A;
        break;

    case Js::OpCode::BrLt_A:
        this->m_opcode = Js::OpCode::BrNotLt_A;
        break;

    case Js::OpCode::BrNotLt_A:
        this->m_opcode = Js::OpCode::BrLt_A;
        break;

    case Js::OpCode::BrLe_A:
        this->m_opcode = Js::OpCode::BrNotLe_A;
        break;

    case Js::OpCode::BrNotLe_A:
        this->m_opcode = Js::OpCode::BrLe_A;
        break;

    case Js::OpCode::BrEq_A:
        this->m_opcode = Js::OpCode::BrNotEq_A;
        break;

    case Js::OpCode::BrNotEq_A:
        this->m_opcode = Js::OpCode::BrEq_A;
        break;

    case Js::OpCode::BrNeq_A:
        this->m_opcode = Js::OpCode::BrNotNeq_A;
        break;

    case Js::OpCode::BrNotNeq_A:
        this->m_opcode = Js::OpCode::BrNeq_A;
        break;

    case Js::OpCode::Br:
        break;

    case Js::OpCode::BrFalse_A:
        this->m_opcode = Js::OpCode::BrTrue_A;
        break;

    case Js::OpCode::BrTrue_A:
        this->m_opcode = Js::OpCode::BrFalse_A;
        break;

    case Js::OpCode::BrSrEq_A:
        this->m_opcode = Js::OpCode::BrSrNotEq_A;
        break;

    case Js::OpCode::BrSrNotEq_A:
        this->m_opcode = Js::OpCode::BrSrEq_A;
        break;

    case Js::OpCode::BrSrNeq_A:
        this->m_opcode = Js::OpCode::BrSrNotNeq_A;
        break;

    case Js::OpCode::BrSrNotNeq_A:
        this->m_opcode = Js::OpCode::BrSrNeq_A;
        break;

    case Js::OpCode::BrOnHasProperty:
        this->m_opcode = Js::OpCode::BrOnNoProperty;
        break;

    case Js::OpCode::BrOnHasLocalProperty:
        this->m_opcode = Js::OpCode::BrOnNoLocalProperty;
        break;

    case Js::OpCode::BrOnNoLocalProperty:
        this->m_opcode = Js::OpCode::BrOnHasLocalProperty;
        break;

    case Js::OpCode::BrOnNoProperty:
        this->m_opcode = Js::OpCode::BrOnHasProperty;
        break;

    case Js::OpCode::BrTrue_I4:
        this->m_opcode = Js::OpCode::BrFalse_I4;
        break;

    case Js::OpCode::BrFalse_I4:
        this->m_opcode = Js::OpCode::BrTrue_I4;
        break;

    case Js::OpCode::BrEq_I4:
        this->m_opcode = Js::OpCode::BrNeq_I4;
        break;

    case Js::OpCode::BrNeq_I4:
        this->m_opcode = Js::OpCode::BrEq_I4;
        break;

    case Js::OpCode::BrGe_I4:
        this->m_opcode = Js::OpCode::BrLt_I4;
        break;

    case Js::OpCode::BrGt_I4:
        this->m_opcode = Js::OpCode::BrLe_I4;
        break;

    case Js::OpCode::BrLe_I4:
        this->m_opcode = Js::OpCode::BrGt_I4;
        break;

    case Js::OpCode::BrLt_I4:
        this->m_opcode = Js::OpCode::BrGe_I4;
        break;

    case Js::OpCode::BrUnGe_A:
        this->m_opcode = Js::OpCode::BrUnLt_A;
        break;

    case Js::OpCode::BrUnGt_A:
        this->m_opcode = Js::OpCode::BrUnLe_A;
        break;

    case Js::OpCode::BrUnLe_A:
        this->m_opcode = Js::OpCode::BrUnGt_A;
        break;

    case Js::OpCode::BrUnLt_A:
        this->m_opcode = Js::OpCode::BrUnGe_A;
        break;
    case Js::OpCode::BrUnGe_I4:
        this->m_opcode = Js::OpCode::BrUnLt_I4;
        break;

    case Js::OpCode::BrUnGt_I4:
        this->m_opcode = Js::OpCode::BrUnLe_I4;
        break;

    case Js::OpCode::BrUnLe_I4:
        this->m_opcode = Js::OpCode::BrUnGt_I4;
        break;

    case Js::OpCode::BrUnLt_I4:
        this->m_opcode = Js::OpCode::BrUnGe_I4;
        break;
    case Js::OpCode::BrOnEmpty:
        this->m_opcode = Js::OpCode::BrOnNotEmpty;
        break;

    case Js::OpCode::BrOnNotEmpty:
        this->m_opcode = Js::OpCode::BrOnEmpty;
        break;
    case Js::OpCode::BrHasSideEffects:
        this->m_opcode = Js::OpCode::BrNotHasSideEffects;
        break;
    case Js::OpCode::BrFncEqApply:
        this->m_opcode = Js::OpCode::BrFncNeqApply;
        break;
    case Js::OpCode::BrFncNeqApply:
        this->m_opcode = Js::OpCode::BrFncEqApply;
        break;
    case Js::OpCode::BrNotHasSideEffects:
        this->m_opcode = Js::OpCode::BrHasSideEffects;
        break;
    case Js::OpCode::BrNotAddr_A:
        this->m_opcode = Js::OpCode::BrAddr_A;
        break;
    case Js::OpCode::BrAddr_A:
        this->m_opcode = Js::OpCode::BrNotAddr_A;
        break;
    case Js::OpCode::BrFncCachedScopeEq:
        this->m_opcode = Js::OpCode::BrFncCachedScopeNeq;
        break;
    case Js::OpCode::BrFncCachedScopeNeq:
        this->m_opcode = Js::OpCode::BrFncCachedScopeEq;
        break;
    case Js::OpCode::BrOnException:
        this->m_opcode = Js::OpCode::BrOnNoException;
        break;

    default:
        AssertMsg(UNREACHED, "Unhandled branch");
    }
}